

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O2

idx_t __thiscall duckdb::ARTKey::GetMismatchPos(ARTKey *this,ARTKey *other,idx_t start)

{
  idx_t iVar1;
  
  for (; (iVar1 = 0xffffffffffffffff, start < other->len &&
         (iVar1 = start, this->data[start] == other->data[start])); start = start + 1) {
  }
  return iVar1;
}

Assistant:

idx_t ARTKey::GetMismatchPos(const ARTKey &other, const idx_t start) const {
	D_ASSERT(len <= other.len);
	D_ASSERT(start <= len);
	for (idx_t i = start; i < other.len; i++) {
		if (data[i] != other.data[i]) {
			return i;
		}
	}
	return DConstants::INVALID_INDEX;
}